

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::operator-=
          (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other)

{
  iterator pvVar1;
  iterator last;
  const_iterator u;
  const_iterator v;
  bool has_borrow;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other_local;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this_local;
  
  if (this == other) {
    pvVar1 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    last = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::end
                     ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                       *)this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(pvVar1,last,0);
  }
  else {
    pvVar1 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    u = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::cbegin
                  ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    v = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::cbegin
                  ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   other);
    uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(pvVar1,u,v,0x40,false);
  }
  return this;
}

Assistant:

constexpr auto operator-=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary subtraction function.
        const auto has_borrow = eval_subtract_n(values.begin(),
                                                values.cbegin(),
                                                other.values.cbegin(),
                                                number_of_limbs,
                                                false);

        static_cast<void>(has_borrow);
      }

      return *this;
    }